

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  ImGuiNextWindowData *pIVar4;
  int *piVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImFontAtlas *pIVar8;
  char *pcVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  int n;
  uint uVar19;
  ImGuiID IVar20;
  ImGuiInputSource IVar21;
  int iVar22;
  ImFont **ppIVar23;
  long lVar24;
  ImFont *font;
  ImGuiWindow *pIVar25;
  ImGuiPopupData *pIVar26;
  ImGuiWindow **ppIVar27;
  int i_1;
  ImGuiID IVar28;
  ImGuiWindow *window;
  long lVar29;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar30;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiNavMoveResult *pIVar31;
  int i_2;
  int i;
  ulong uVar32;
  float *pfVar33;
  ImGuiNavLayer IVar34;
  float *pfVar35;
  bool *pbVar36;
  ImGuiContext *pIVar37;
  ImGuiWindow *old_nav_window;
  byte bVar38;
  uint uVar39;
  ImVec2 IVar40;
  ImVec2 IVar41;
  ImVec2 IVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  ImVec2 IVar46;
  undefined1 auVar47 [16];
  double dVar45;
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  long lStack_90;
  undefined1 local_88 [16];
  float local_78;
  ImRect rect_abs;
  ImVec2 delta_scroll;
  ImRect local_40;
  
  local_88._8_8_ = local_88._0_8_;
  pIVar15 = GImGui;
  bVar38 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe3d,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe25,"void NewFrameSanityChecks()");
  }
  iVar22 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar22 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe26,"void NewFrameSanityChecks()");
    }
  }
  else if ((iVar22 != 0) && (GImGui->FrameCountEnded != iVar22)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe27,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe28,"void NewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe29,"void NewFrameSanityChecks()");
  }
  ppIVar23 = ImVector<ImFont_*>::operator[](&pIVar8->Fonts,0);
  if ((*ppIVar23)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2a,"void NewFrameSanityChecks()");
  }
  if ((pIVar15->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2b,"void NewFrameSanityChecks()");
  }
  fVar55 = (pIVar15->Style).Alpha;
  if ((fVar55 < 0.0) || (1.0 < fVar55)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2c,"void NewFrameSanityChecks()");
  }
  if (((pIVar15->Style).WindowMinSize.x < 1.0) || ((pIVar15->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2d,"void NewFrameSanityChecks()");
  }
  if (1 < (uint)(pIVar15->Style).WindowMenuButtonPosition) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2e,"void NewFrameSanityChecks()");
  }
  lVar24 = 0;
  while (lVar24 != 0x16) {
    piVar5 = (pIVar15->IO).KeyMap + lVar24;
    lVar24 = lVar24 + 1;
    if (0x200 < *piVar5 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe30,"void NewFrameSanityChecks()");
    }
  }
  if ((((pIVar15->IO).ConfigFlags & 1) != 0) && ((pIVar15->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe34,"void NewFrameSanityChecks()");
  }
  if (((pIVar15->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar15->IO).BackendFlags & 2) == 0)) {
    (pIVar15->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar15->SettingsLoaded == false) {
    if ((pIVar15->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe4a,"void ImGui::NewFrame()");
    }
    pcVar9 = (pIVar15->IO).IniFilename;
    if (pcVar9 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar9);
    }
    pIVar15->SettingsLoaded = true;
  }
  fVar55 = (pIVar15->IO).DeltaTime;
  if ((0.0 < pIVar15->SettingsDirtyTimer) &&
     (fVar49 = pIVar15->SettingsDirtyTimer - fVar55, pIVar15->SettingsDirtyTimer = fVar49,
     fVar49 <= 0.0)) {
    pcVar9 = (pIVar15->IO).IniFilename;
    if (pcVar9 == (char *)0x0) {
      (pIVar15->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar9);
      fVar55 = (pIVar15->IO).DeltaTime;
    }
    pIVar15->SettingsDirtyTimer = 0.0;
  }
  pIVar15->Time = (double)fVar55 + pIVar15->Time;
  pIVar15->FrameScopeActive = true;
  pIVar15->FrameCount = pIVar15->FrameCount + 1;
  pIVar15->TooltipOverrideCount = 0;
  pIVar15->WindowsActiveCount = 0;
  ((pIVar15->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar15->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe67,"void ImGui::NewFrame()");
  }
  fVar55 = (pIVar15->IO).DisplaySize.x;
  fVar49 = (pIVar15->IO).DisplaySize.y;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.z = fVar55;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.w = fVar49;
  (pIVar15->DrawListSharedData).CurveTessellationTol = (pIVar15->Style).CurveTessellationTol;
  bVar17 = (pIVar15->Style).AntiAliasedLines;
  uVar19 = (uint)bVar17;
  (pIVar15->DrawListSharedData).InitialFlags = (uint)bVar17;
  if ((pIVar15->Style).AntiAliasedFill == true) {
    uVar19 = bVar17 | 2;
    (pIVar15->DrawListSharedData).InitialFlags = uVar19;
  }
  if (((pIVar15->IO).BackendFlags & 8) != 0) {
    (pIVar15->DrawListSharedData).InitialFlags = uVar19 | 4;
  }
  pIVar1 = &pIVar15->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar15->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar15->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar15->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar15->DrawData).Valid = false;
  (pIVar15->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar15->DrawData).CmdListsCount = 0;
  (pIVar15->DrawData).TotalIdxCount = 0;
  (pIVar15->DrawData).TotalVtxCount = 0;
  (pIVar15->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar15->DrawData).DisplayPos.y = 0;
  (pIVar15->DrawData).DisplaySize.x = 0.0;
  (pIVar15->DrawData).DisplaySize.y = 0.0;
  (pIVar15->DrawData).FramebufferScale.x = 0.0;
  (pIVar15->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar15->DragDropActive == true) &&
     (IVar28 = (pIVar15->DragDropPayload).SourceId, IVar28 == pIVar15->ActiveId)) {
    KeepAliveID(IVar28);
  }
  if (pIVar15->HoveredIdPreviousFrame == 0) {
    IVar28 = pIVar15->HoveredId;
    pIVar15->HoveredIdTimer = 0.0;
    pIVar15->HoveredIdNotActiveTimer = 0.0;
    if (IVar28 == 0) goto LAB_001456e3;
LAB_001456b8:
    fVar55 = (pIVar15->IO).DeltaTime;
    pIVar15->HoveredIdTimer = pIVar15->HoveredIdTimer + fVar55;
    IVar20 = IVar28;
    if (pIVar15->ActiveId != IVar28) {
      pIVar15->HoveredIdNotActiveTimer = fVar55 + pIVar15->HoveredIdNotActiveTimer;
      IVar20 = pIVar15->ActiveId;
    }
  }
  else {
    IVar28 = pIVar15->HoveredId;
    if (IVar28 != 0) {
      if (pIVar15->ActiveId == IVar28) {
        pIVar15->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_001456b8;
    }
LAB_001456e3:
    IVar28 = 0;
    IVar20 = pIVar15->ActiveId;
  }
  pIVar15->HoveredIdPreviousFrame = IVar28;
  pIVar15->HoveredId = 0;
  pIVar15->HoveredIdAllowOverlap = false;
  if (((pIVar15->ActiveIdIsAlive != IVar20) && (IVar20 != 0)) &&
     (pIVar15->ActiveIdPreviousFrame == IVar20)) {
    ClearActiveID();
    IVar20 = pIVar15->ActiveId;
  }
  fVar55 = (pIVar15->IO).DeltaTime;
  if (IVar20 != 0) {
    pIVar15->ActiveIdTimer = pIVar15->ActiveIdTimer + fVar55;
  }
  pIVar15->LastActiveIdTimer = pIVar15->LastActiveIdTimer + fVar55;
  pIVar15->ActiveIdPreviousFrame = IVar20;
  pIVar15->ActiveIdPreviousFrameWindow = pIVar15->ActiveIdWindow;
  pIVar15->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar15->ActiveIdHasBeenEditedBefore;
  pIVar15->ActiveIdIsAlive = 0;
  pIVar15->ActiveIdHasBeenEditedThisFrame = false;
  pIVar15->ActiveIdPreviousFrameIsAlive = false;
  pIVar15->ActiveIdIsJustActivated = false;
  if ((pIVar15->TempInputTextId != 0) && (IVar20 != pIVar15->TempInputTextId)) {
    pIVar15->TempInputTextId = 0;
  }
  pIVar15->DragDropAcceptIdPrev = pIVar15->DragDropAcceptIdCurr;
  pIVar15->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar15->DragDropAcceptIdCurr = 0;
  pIVar15->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar15->IO).KeysDownDuration;
  memcpy((pIVar15->IO).KeysDownDurationPrev,pfVar2,0x800);
  for (lVar24 = 0; pIVar37 = GImGui, lVar24 != 0x200; lVar24 = lVar24 + 1) {
    fVar49 = -1.0;
    if ((pIVar15->IO).KeysDown[lVar24] == true) {
      fVar49 = 0.0;
      if (0.0 <= pfVar2[lVar24]) {
        fVar49 = pfVar2[lVar24] + fVar55;
      }
    }
    pfVar2[lVar24] = fVar49;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar19 = (pIVar37->IO).ConfigFlags;
  if (((uVar19 & 2) == 0) || (((pIVar37->IO).BackendFlags & 1) == 0)) {
    bVar14 = 0;
  }
  else if ((((0.0 < (pIVar37->IO).NavInputs[0]) || (0.0 < (pIVar37->IO).NavInputs[2])) ||
           (0.0 < (pIVar37->IO).NavInputs[1])) || (bVar14 = 1, 0.0 < (pIVar37->IO).NavInputs[3])) {
    pIVar37->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar14 = 1;
  }
  if ((uVar19 & 1) != 0) {
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[0xc]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[0] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[0xd]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[2] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[0xe]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[1] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[1]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[0x12] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[2]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[0x13] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[3]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[0x14] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[4]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[0x15] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = IsKeyDown((pIVar37->IO).KeyMap[0]);
    if (bVar17) {
      (pIVar37->IO).NavInputs[0x11] = 1.0;
      pIVar37->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar17 = (pIVar37->IO).KeyCtrl;
    if (bVar17 == true) {
      (pIVar37->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar37->IO).KeyShift == true) {
      (pIVar37->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar17 == false) && ((pIVar37->IO).KeyAlt != false)) {
      (pIVar37->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar37->IO).NavInputsDownDuration;
  pfVar33 = pfVar2;
  pfVar35 = (pIVar37->IO).NavInputsDownDurationPrev;
  for (lVar24 = 0xb; lVar24 != 0; lVar24 = lVar24 + -1) {
    *(undefined8 *)pfVar35 = *(undefined8 *)pfVar33;
    pfVar33 = pfVar33 + (ulong)bVar38 * -4 + 2;
    pfVar35 = pfVar35 + (ulong)bVar38 * -4 + 2;
  }
  for (lVar24 = 0; lVar24 != 0x16; lVar24 = lVar24 + 1) {
    fVar55 = -1.0;
    if (0.0 < (pIVar37->IO).NavInputs[lVar24]) {
      fVar55 = 0.0;
      if (0.0 <= pfVar2[lVar24]) {
        fVar55 = pfVar2[lVar24] + (pIVar37->IO).DeltaTime;
      }
    }
    pfVar2[lVar24] = fVar55;
  }
  IVar28 = pIVar37->NavInitResultId;
  if (((IVar28 != 0) &&
      ((pIVar37->NavDisableHighlight != true || (pIVar37->NavInitRequestFromMove == true)))) &&
     (pIVar37->NavWindow != (ImGuiWindow *)0x0)) {
    if (pIVar37->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar28,pIVar37->NavLayer,&pIVar37->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar28,pIVar37->NavLayer);
    }
    IVar41 = (pIVar37->NavInitResultRectRel).Max;
    pIVar6 = &pIVar37->NavWindow->NavRectRel[pIVar37->NavLayer].Min;
    *pIVar6 = (pIVar37->NavInitResultRectRel).Min;
    pIVar6[1] = IVar41;
  }
  pIVar37->NavInitRequest = false;
  pIVar37->NavInitRequestFromMove = false;
  pIVar37->NavInitResultId = 0;
  pIVar37->NavJustMovedToId = 0;
  pIVar16 = GImGui;
  if (pIVar37->NavMoveRequest == true) {
    IVar28 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar28 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar16->NavDisableHighlight = false;
        pIVar16->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar31 = &GImGui->NavMoveResultLocal;
      if (IVar28 == 0) {
        pIVar31 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar28 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar28 != 0)) &&
         (IVar28 != GImGui->NavId)) {
        pIVar31 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar31 == pIVar3) {
LAB_00145bbf:
        pIVar31 = pIVar3;
      }
      else if ((pIVar3->ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar55 = (GImGui->NavMoveResultOther).DistBox;
        fVar49 = pIVar31->DistBox;
        if (fVar49 <= fVar55) {
          if (((fVar55 != fVar49) || (NAN(fVar55) || NAN(fVar49))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar31->DistCenter < *pfVar2 || pIVar31->DistCenter == *pfVar2)) goto LAB_00145bc2;
        }
        goto LAB_00145bbf;
      }
LAB_00145bc2:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar31->Window == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x2113,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        IVar41 = pIVar31->Window->Pos;
        IVar40 = (pIVar31->RectRel).Min;
        IVar42 = (pIVar31->RectRel).Max;
        fVar55 = IVar41.x;
        fVar49 = IVar41.y;
        rect_abs.Max.x = IVar42.x + fVar55;
        rect_abs.Max.y = IVar42.y + fVar49;
        rect_abs.Min.y = IVar40.y + fVar49;
        rect_abs.Min.x = IVar40.x + fVar55;
        NavScrollToBringItemIntoView(pIVar31->Window,&rect_abs);
        pIVar25 = pIVar31->Window;
        IVar40 = CalcNextScrollFromScrollTargetAndClamp(pIVar25,false);
        IVar41 = pIVar25->Scroll;
        delta_scroll.y = IVar41.y - IVar40.y;
        delta_scroll.x = IVar41.x - IVar40.x;
        ImRect::Translate(&pIVar31->RectRel,&delta_scroll);
        if ((pIVar31->Window->Flags & 0x1000000) != 0) {
          local_40.Min.x = rect_abs.Min.x + delta_scroll.x;
          local_40.Min.y = rect_abs.Min.y + delta_scroll.y;
          local_40.Max.x = rect_abs.Max.x + delta_scroll.x;
          local_40.Max.y = rect_abs.Max.y + delta_scroll.y;
          NavScrollToBringItemIntoView(pIVar31->Window->ParentWindow,&local_40);
        }
      }
      ClearActiveID();
      pIVar16->NavWindow = pIVar31->Window;
      IVar28 = pIVar31->ID;
      if (pIVar16->NavId != IVar28) {
        pIVar16->NavJustMovedToId = IVar28;
        pIVar16->NavJustMovedToMultiSelectScopeId = pIVar31->SelectScopeId;
      }
      SetNavIDWithRectRel(IVar28,pIVar16->NavLayer,&pIVar31->RectRel);
      pIVar16->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar37->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar37->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x2022,"void ImGui::NavUpdate()");
    }
    if (((pIVar37->NavMoveResultLocal).ID == 0) && ((pIVar37->NavMoveResultOther).ID == 0)) {
      pIVar37->NavDisableHighlight = false;
    }
    pIVar37->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar37->NavMousePosDirty == true) && (pIVar37->NavIdIsAlive == true)) {
    if (((((pIVar37->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar37->IO).BackendFlags & 4) != 0 && (pIVar37->NavDisableHighlight == false)) &&
         (pIVar37->NavDisableMouseHover == true)))) && (pIVar37->NavWindow != (ImGuiWindow *)0x0)) {
      IVar41 = NavCalcPreferredRefPos();
      (pIVar37->IO).MousePosPrev = IVar41;
      (pIVar37->IO).MousePos = IVar41;
      (pIVar37->IO).WantSetMousePos = true;
    }
    pIVar37->NavMousePosDirty = false;
  }
  pIVar37->NavIdIsAlive = false;
  pIVar37->NavJustTabbedId = 0;
  IVar34 = pIVar37->NavLayer;
  if (ImGuiNavLayer_Menu < IVar34) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x2038,"void ImGui::NavUpdate()");
  }
  pIVar25 = pIVar37->NavWindow;
  pIVar30 = pIVar25;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    for (; pIVar30 != (ImGuiWindow *)0x0; pIVar30 = pIVar30->ParentWindow) {
      if ((pIVar30->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar30 != pIVar25) {
          pIVar30->NavLastChildNavWindow = pIVar25;
        }
        break;
      }
    }
    if ((IVar34 == ImGuiNavLayer_Main) && (pIVar25->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar25->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16 = GImGui;
  pIVar25 = GetTopMostPopupModal();
  if (pIVar25 == (ImGuiWindow *)0x0) {
    if (pIVar16->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_00145e4e;
LAB_00145e55:
      bVar17 = IsNavInputPressed(3,ImGuiInputReadMode_Pressed);
      if (((pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar16->IO).KeyCtrl == true))
         && (bVar18 = IsKeyPressedMap(0,true), bVar18)) {
        bVar38 = (byte)(pIVar16->IO).ConfigFlags;
        uVar39 = (uint)bVar38;
        if (bVar17 || (bVar38 & 1) != 0) {
LAB_00145e98:
          pIVar25 = pIVar16->NavWindow;
          if ((pIVar25 != (ImGuiWindow *)0x0) ||
             (pIVar25 = FindWindowNavFocusable
                                  ((pIVar16->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar25 != (ImGuiWindow *)0x0)) {
            pIVar16->NavWindowingTargetAnim = pIVar25;
            pIVar16->NavWindowingTarget = pIVar25;
            pIVar16->NavWindowingTimer = 0.0;
            pIVar16->NavWindowingHighlightAlpha = 0.0;
            pIVar16->NavWindowingToggleLayer = (bool)(~(byte)uVar39 & 1);
            pIVar16->NavInputSource = ImGuiInputSource_NavGamepad - (uVar39 & 1);
          }
        }
      }
      else if (bVar17) {
        uVar39 = 0;
        goto LAB_00145e98;
      }
      bVar17 = pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar55 = (pIVar16->IO).DeltaTime * -10.0 + pIVar16->NavWindowingHighlightAlpha;
        fVar55 = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
        pIVar16->NavWindowingHighlightAlpha = fVar55;
        if ((pIVar16->DimBgRatio <= 0.0) && (fVar55 <= 0.0)) {
          pIVar16->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_00145e55;
      }
LAB_00145e4e:
      bVar17 = false;
    }
    fVar55 = (pIVar16->IO).DeltaTime + pIVar16->NavWindowingTimer;
    pIVar16->NavWindowingTimer = fVar55;
    if (bVar17) {
LAB_00146072:
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_88._0_8_;
      local_88 = auVar13 << 0x40;
      pIVar25 = (ImGuiWindow *)0x0;
    }
    else {
      IVar21 = pIVar16->NavInputSource;
      if (IVar21 != ImGuiInputSource_NavGamepad) {
LAB_00145fe5:
        if (IVar21 == ImGuiInputSource_NavKeyboard) {
          fVar49 = (pIVar16->NavWindowingTimer + -0.2) / 0.05;
          fVar55 = 1.0;
          if (fVar49 <= 1.0) {
            fVar55 = fVar49;
          }
          fVar55 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar55);
          uVar39 = -(uint)(fVar55 <= pIVar16->NavWindowingHighlightAlpha);
          pIVar16->NavWindowingHighlightAlpha =
               (float)(uVar39 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar39 & (uint)fVar55);
          bVar17 = IsKeyPressedMap(0,true);
          if (bVar17) {
            NavUpdateWindowingHighlightWindow((pIVar16->IO).KeyShift - 1 | 1);
          }
          if ((pIVar16->IO).KeyCtrl == false) {
            pIVar25 = pIVar16->NavWindowingTarget;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = local_88._0_8_;
            local_88 = auVar52 << 0x40;
            goto LAB_0014607d;
          }
        }
        goto LAB_00146072;
      }
      fVar49 = (fVar55 + -0.2) / 0.05;
      fVar55 = 1.0;
      if (fVar49 <= 1.0) {
        fVar55 = fVar49;
      }
      fVar55 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar55);
      uVar39 = -(uint)(fVar55 <= pIVar16->NavWindowingHighlightAlpha);
      pIVar16->NavWindowingHighlightAlpha =
           (float)(uVar39 & (uint)pIVar16->NavWindowingHighlightAlpha | ~uVar39 & (uint)fVar55);
      bVar17 = IsNavInputPressed(0xc,ImGuiInputReadMode_RepeatSlow);
      bVar18 = IsNavInputPressed(0xd,ImGuiInputReadMode_RepeatSlow);
      if ((uint)bVar17 - (uint)bVar18 != 0) {
        NavUpdateWindowingHighlightWindow((uint)bVar17 - (uint)bVar18);
        pIVar16->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00146072;
        IVar21 = pIVar16->NavInputSource;
        goto LAB_00145fe5;
      }
      uVar32 = (ulong)GImGui >> 8;
      pbVar36 = &pIVar16->NavWindowingToggleLayer;
      *pbVar36 = (bool)(*pbVar36 &
                       (pIVar16->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar16->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar36 == false) {
        pIVar25 = pIVar16->NavWindowingTarget;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_88._0_8_;
        local_88 = auVar12 << 0x40;
      }
      else {
        local_88._1_7_ = (int7)uVar32;
        local_88[0] = pIVar16->NavWindow != (ImGuiWindow *)0x0;
        pIVar25 = (ImGuiWindow *)0x0;
      }
      pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_0014607d:
    auVar52 = local_88;
    dir_sources = 1;
    bVar17 = IsNavInputPressed(0x10,ImGuiInputReadMode_Pressed);
    if (bVar17) {
      pIVar16->NavWindowingToggleLayer = true;
    }
    if (((pIVar16->ActiveId == 0) || (pIVar16->ActiveIdAllowOverlap == true)) &&
       ((pIVar16->NavWindowingToggleLayer == true &&
        (bVar17 = IsNavInputPressed(0x10,ImGuiInputReadMode_Released), bVar17)))) {
      bVar17 = IsMousePosValid(&(pIVar16->IO).MousePos);
      bVar18 = IsMousePosValid(&(pIVar16->IO).MousePosPrev);
      local_88._1_7_ = 0;
      local_88[0] = bVar18 == bVar17 | local_88[0];
      local_88._8_8_ = auVar52._8_8_;
    }
    pIVar30 = pIVar16->NavWindowingTarget;
    if ((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 4) == 0)) {
      if (pIVar16->NavInputSource == ImGuiInputSource_NavGamepad) {
        dir_sources = 4;
LAB_00146182:
        IVar41 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      }
      else {
        IVar41.x = 0.0;
        IVar41.y = 0.0;
        if ((pIVar16->NavInputSource == ImGuiInputSource_NavKeyboard) &&
           ((pIVar16->IO).KeyShift == false)) goto LAB_00146182;
      }
      fVar55 = IVar41.x;
      fVar49 = IVar41.y;
      if ((((fVar55 != 0.0) || (NAN(fVar55))) || (fVar49 != 0.0)) || (NAN(fVar49))) {
        fVar50 = (pIVar16->IO).DisplayFramebufferScale.x;
        fVar56 = (pIVar16->IO).DisplayFramebufferScale.y;
        if (fVar56 <= fVar50) {
          fVar50 = fVar56;
        }
        fVar50 = (float)(int)(fVar50 * (pIVar16->IO).DeltaTime * 800.0);
        IVar41 = pIVar30->RootWindow->Pos;
        rect_abs.Min.y = IVar41.y + fVar49 * fVar50;
        rect_abs.Min.x = IVar41.x + fVar55 * fVar50;
        SetWindowPos(pIVar30->RootWindow,&rect_abs.Min,1);
        pIVar16->NavDisableMouseHover = true;
        MarkIniSettingsDirty(pIVar16->NavWindowingTarget);
      }
    }
    if (pIVar25 != (ImGuiWindow *)0x0) {
      if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) || (pIVar25 != pIVar16->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar16->NavDisableHighlight = false;
        pIVar16->NavDisableMouseHover = true;
        pIVar30 = pIVar25->NavLastChildNavWindow;
        if (pIVar25->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar30 = pIVar25;
        }
        ClosePopupsOverWindow(pIVar30,false);
        FocusWindow(pIVar30);
        if (pIVar30->NavLastIds[0] == 0) {
          NavInitWindow(pIVar30,false);
        }
        if ((pIVar30->DC).NavLayerActiveMask == 2) {
          pIVar16->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if (((local_88 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (pIVar25 = pIVar16->NavWindow, pIVar30 = pIVar25, pIVar25 != (ImGuiWindow *)0x0)) {
      while (window = pIVar30, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar30 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar25) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar25;
        pIVar25 = pIVar16->NavWindow;
      }
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
      IVar34 = ImGuiNavLayer_Main;
      if (((pIVar25->DC).NavLayerActiveMask & 2) != 0) {
        IVar34 = pIVar16->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar34);
    }
  }
  else {
    pIVar16->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar19 & 1) == 0 & (bVar14 ^ 1))) || (pIVar37->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar37->IO).NavActive = false;
LAB_00146357:
    bVar17 = pIVar37->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar17 = (pIVar37->NavWindow->Flags & 0x40000U) == 0;
    (pIVar37->IO).NavActive = bVar17;
    if (((!bVar17) || (pIVar37->NavId == 0)) ||
       (bVar17 = true, pIVar37->NavDisableHighlight != false)) goto LAB_00146357;
  }
  (pIVar37->IO).NavVisible = bVar17;
  bVar17 = IsNavInputPressed(1,ImGuiInputReadMode_Pressed);
  if (bVar17) {
    if (pIVar37->ActiveId == 0) {
      pIVar25 = pIVar37->NavWindow;
      if (((pIVar25 == (ImGuiWindow *)0x0) || ((pIVar25->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar25->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar37->OpenPopupStack).Size < 1) {
          if (pIVar37->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x5000000U) != 0x1000000)) {
              pIVar25->NavLastIds[0] = 0;
            }
            pIVar37->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar26 = ImVector<ImGuiPopupData>::back(&pIVar37->OpenPopupStack);
          if ((pIVar26->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar37->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar25->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                        ,0x2054,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar25->ParentWindow);
        SetNavID(pIVar25->ChildId,0);
        pIVar37->NavIdIsAlive = false;
        if (pIVar37->NavDisableMouseHover == true) {
          pIVar37->NavMousePosDirty = true;
        }
      }
    }
    else if ((pIVar37->ActiveIdBlockNavInputFlags & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar37->NavActivateId = 0;
  pIVar37->NavActivateDownId = 0;
  pIVar37->NavActivatePressedId = 0;
  pIVar37->NavInputId = 0;
  if (((pIVar37->NavId == 0) || (pIVar37->NavDisableHighlight != false)) ||
     (pIVar37->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001464c8:
    pIVar25 = pIVar37->NavWindow;
    if (pIVar25 == (ImGuiWindow *)0x0) goto LAB_00146530;
    if ((pIVar25->Flags & 0x40000) != 0) {
      pIVar37->NavDisableHighlight = true;
    }
    bVar17 = false;
  }
  else {
    if (pIVar37->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar37->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar17 = IsNavInputPressed(0,ImGuiInputReadMode_Pressed);
          IVar28 = pIVar37->ActiveId;
          IVar20 = pIVar37->NavId;
          if (IVar28 == 0 && bVar17) {
            pIVar37->NavActivateId = IVar20;
            pIVar37->NavActivateDownId = IVar20;
LAB_0014688b:
            pIVar37->NavActivatePressedId = IVar20;
          }
          else if (IVar28 == 0) {
            pIVar37->NavActivateDownId = IVar20;
            if (bVar17) goto LAB_0014688b;
          }
          else {
            bVar18 = IVar28 == IVar20;
            if (!bVar18) goto LAB_001464c8;
            pIVar37->NavActivateDownId = IVar28;
            IVar20 = IVar28;
            if (bVar17 && bVar18) goto LAB_0014688b;
          }
LAB_00146892:
          bVar17 = IsNavInputPressed(2,ImGuiInputReadMode_Pressed);
          if (bVar17) {
            pIVar37->NavInputId = pIVar37->NavId;
          }
        }
        else if (pIVar37->ActiveId == pIVar37->NavId || pIVar37->ActiveId == 0) goto LAB_00146892;
      }
      goto LAB_001464c8;
    }
LAB_00146530:
    bVar17 = true;
    pIVar25 = (ImGuiWindow *)0x0;
  }
  IVar28 = pIVar37->NavActivateId;
  if ((IVar28 != 0) && (pIVar37->NavActivateDownId != IVar28)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x2081,"void ImGui::NavUpdate()");
  }
  pIVar37->NavMoveRequest = false;
  IVar28 = pIVar37->NavNextActivateId;
  if (IVar28 != 0) {
    pIVar37->NavActivateId = IVar28;
    pIVar37->NavActivateDownId = IVar28;
    pIVar37->NavActivatePressedId = IVar28;
    pIVar37->NavInputId = IVar28;
  }
  pIVar37->NavNextActivateId = 0;
  if (pIVar37->ActiveId == 0) {
    uVar32 = 0xffffffffffffffff;
  }
  else {
    uVar32 = (ulong)(uint)pIVar37->ActiveIdAllowNavDirFlags;
  }
  if (pIVar37->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar37->NavMoveDir = -1;
    pIVar37->NavMoveRequestFlags = 0;
    if (((!bVar17) && ((int)uVar32 != 0 && pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar25->Flags & 0x40000) == 0)) {
      if (((uVar32 & 1) != 0) &&
         (bVar17 = IsNavInputPressedAnyOfTwo(4,0x12,ImGuiInputReadMode_Repeat), bVar17)) {
        pIVar37->NavMoveDir = 0;
      }
      if (((uVar32 & 2) != 0) &&
         (bVar17 = IsNavInputPressedAnyOfTwo(5,0x13,ImGuiInputReadMode_Repeat), bVar17)) {
        pIVar37->NavMoveDir = 1;
      }
      if (((uVar32 & 4) != 0) &&
         (bVar17 = IsNavInputPressedAnyOfTwo(6,0x14,ImGuiInputReadMode_Repeat), bVar17)) {
        pIVar37->NavMoveDir = 2;
      }
      if (((uVar32 & 8) != 0) &&
         (bVar17 = IsNavInputPressedAnyOfTwo(7,0x15,ImGuiInputReadMode_Repeat), bVar17)) {
        pIVar37->NavMoveDir = 3;
      }
    }
    pIVar37->NavMoveClipDir = pIVar37->NavMoveDir;
  }
  else {
    if ((pIVar37->NavMoveDir == -1) || (pIVar37->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x209c,"void ImGui::NavUpdate()");
    }
    if (pIVar37->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x209d,"void ImGui::NavUpdate()");
    }
    pIVar37->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar16 = GImGui;
  local_78 = 0.0;
  if ((((((uVar19 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar25 = GImGui->NavWindow, pIVar25 != (ImGuiWindow *)0x0)) &&
      (((pIVar25->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar17 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar18 = IsKeyDown((pIVar16->IO).KeyMap[6]);
    if (((byte)((uVar32 & 0xffffffff) >> 2) & 0x3f & bVar17) != ((byte)uVar32 >> 3 & bVar18)) {
      if (((pIVar25->DC).NavLayerActiveMask == 0) && ((pIVar25->DC).NavHasScroll == true)) {
        bVar17 = IsKeyPressed((pIVar16->IO).KeyMap[5],true);
        if (bVar17) {
          fVar55 = (pIVar25->Scroll).y - ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y);
        }
        else {
          bVar17 = IsKeyPressed((pIVar16->IO).KeyMap[6],true);
          if (!bVar17) goto LAB_001466c0;
          fVar55 = ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) + (pIVar25->Scroll).y;
        }
        (pIVar25->ScrollTarget).y = fVar55;
        (pIVar25->ScrollTargetCenterRatio).y = 0.0;
      }
      else {
        IVar34 = pIVar16->NavLayer;
        fVar55 = (pIVar25->InnerRect).Max.y;
        fVar49 = (pIVar25->InnerRect).Min.y;
        fVar50 = ImGuiWindow::CalcFontSize(pIVar25);
        fVar55 = (pIVar25->NavRectRel[IVar34].Max.y - pIVar25->NavRectRel[IVar34].Min.y) +
                 ((fVar55 - fVar49) - fVar50);
        local_78 = 0.0;
        fVar55 = (float)(~-(uint)(fVar55 <= 0.0) & (uint)fVar55);
        bVar17 = IsKeyPressed((pIVar16->IO).KeyMap[5],true);
        if (bVar17) {
          pIVar16->NavMoveDir = 3;
          pIVar16->NavMoveClipDir = 2;
          pIVar16->NavMoveRequestFlags = 0x30;
          local_78 = -fVar55;
        }
        else {
          bVar17 = IsKeyPressed((pIVar16->IO).KeyMap[6],true);
          if (bVar17) {
            pIVar16->NavMoveDir = 2;
            pIVar16->NavMoveClipDir = 3;
            pIVar16->NavMoveRequestFlags = 0x30;
            local_78 = fVar55;
          }
        }
      }
    }
  }
LAB_001466c0:
  if (pIVar37->NavMoveDir == -1) {
    if ((pIVar37->NavMoveRequest & 1U) != 0) goto LAB_001466e7;
  }
  else {
    pIVar37->NavMoveRequest = true;
    pIVar37->NavMoveDirLast = pIVar37->NavMoveDir;
LAB_001466e7:
    if (pIVar37->NavId == 0) {
      pIVar37->NavInitRequest = true;
      pIVar37->NavInitRequestFromMove = true;
      pIVar37->NavInitResultId = 0;
      pIVar37->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar25 = pIVar37->NavWindow;
  if (((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x40000) == 0)) &&
     (pIVar37->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = ImGuiWindow::CalcFontSize(pIVar25);
    fVar55 = (float)(int)(fVar55 * 100.0 * (pIVar37->IO).DeltaTime + 0.5);
    if ((((pIVar25->DC).NavLayerActiveMask == 0) && ((pIVar25->DC).NavHasScroll == true)) &&
       (pIVar37->NavMoveRequest == true)) {
      uVar19 = pIVar37->NavMoveDir;
      if (uVar19 < 2) {
        lVar24 = 0x6c;
        lVar29 = 100;
        uVar39 = 0;
        lStack_90 = 0x54;
      }
      else {
        if ((uVar19 & 0xfffffffe) != 2) goto LAB_0014691d;
        uVar39 = 2;
        lVar24 = 0x70;
        lVar29 = 0x68;
        lStack_90 = 0x58;
      }
      *(float *)((long)&pIVar25->Name + lVar29) =
           (float)(int)(*(float *)(&DAT_0018d338 + (ulong)(uVar19 == uVar39) * 4) * fVar55 +
                       *(float *)((long)&pIVar25->Name + lStack_90));
      *(undefined4 *)((long)&pIVar25->Name + lVar24) = 0;
    }
LAB_0014691d:
    IVar41 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar49 = IVar41.x;
    fVar50 = IVar41.y;
    if (((fVar49 != 0.0) || (NAN(fVar49))) && (pIVar25->ScrollbarX == true)) {
      (pIVar25->ScrollTarget).x = (float)(int)(fVar49 * fVar55 + (pIVar25->Scroll).x);
      (pIVar25->ScrollTargetCenterRatio).x = 0.0;
      pIVar37->NavMoveFromClampedRefRect = true;
    }
    if ((fVar50 != 0.0) || (NAN(fVar50))) {
      (pIVar25->ScrollTarget).y = (float)(int)(fVar50 * fVar55 + (pIVar25->Scroll).y);
      (pIVar25->ScrollTargetCenterRatio).y = 0.0;
      pIVar37->NavMoveFromClampedRefRect = true;
    }
  }
  ImGuiNavMoveResult::Clear(&pIVar37->NavMoveResultLocal);
  ImGuiNavMoveResult::Clear(&pIVar37->NavMoveResultLocalVisibleSet);
  ImGuiNavMoveResult::Clear(&pIVar37->NavMoveResultOther);
  if (((pIVar37->NavMoveRequest == true) && (pIVar37->NavMoveFromClampedRefRect == true)) &&
     (pIVar37->NavLayer == ImGuiNavLayer_Main)) {
    pIVar25 = pIVar37->NavWindow;
    IVar41 = (pIVar25->InnerRect).Min;
    fVar55 = (pIVar25->Pos).x;
    fVar49 = (pIVar25->Pos).y;
    IVar40 = (pIVar25->InnerRect).Max;
    rect_abs.Max.x = (IVar40.x - fVar55) + 1.0;
    rect_abs.Max.y = (IVar40.y - fVar49) + 1.0;
    rect_abs.Min.y = (IVar41.y - fVar49) + -1.0;
    rect_abs.Min.x = (IVar41.x - fVar55) + -1.0;
    bVar17 = ImRect::Contains(&rect_abs,pIVar25->NavRectRel);
    if (!bVar17) {
      fVar55 = ImGuiWindow::CalcFontSize(pIVar25);
      auVar47._0_4_ = fVar55 * 0.5;
      auVar51._0_4_ = rect_abs.Max.x - rect_abs.Min.x;
      auVar51._4_4_ = rect_abs.Max.y - rect_abs.Min.y;
      auVar51._8_4_ = rect_abs.Max.x - rect_abs.Max.x;
      auVar51._12_4_ = rect_abs.Max.y - rect_abs.Max.y;
      auVar47._4_4_ = auVar47._0_4_;
      auVar47._8_4_ = auVar47._0_4_;
      auVar47._12_4_ = auVar47._0_4_;
      auVar52 = minps(auVar51,auVar47);
      rect_abs.Max.x = rect_abs.Max.x - auVar52._0_4_;
      rect_abs.Max.y = rect_abs.Max.y - auVar52._4_4_;
      rect_abs.Min.y = auVar52._4_4_ + rect_abs.Min.y;
      rect_abs.Min.x = auVar52._0_4_ + rect_abs.Min.x;
      ImRect::ClipWith(pIVar25->NavRectRel + pIVar37->NavLayer,&rect_abs);
      pIVar37->NavId = 0;
    }
    pIVar37->NavMoveFromClampedRefRect = false;
  }
  pIVar25 = pIVar37->NavWindow;
  if (pIVar25 == (ImGuiWindow *)0x0) {
    IVar40 = (GImGui->IO).DisplaySize;
    fVar55 = 0.0;
    fVar49 = 0.0;
  }
  else {
    IVar41 = pIVar25->NavRectRel[pIVar37->NavLayer].Min;
    IVar40 = pIVar25->NavRectRel[pIVar37->NavLayer].Max;
    fVar50 = IVar41.x;
    fVar56 = IVar41.y;
    IVar42.x = 0.0;
    IVar42.y = 0.0;
    fVar55 = 0.0;
    fVar49 = 0.0;
    if (fVar56 <= IVar40.y && fVar50 <= IVar40.x) {
      fVar55 = fVar50;
      fVar49 = fVar56;
      IVar42 = IVar40;
    }
    fVar50 = (pIVar25->Pos).x;
    fVar55 = fVar55 + fVar50;
    fVar56 = (pIVar25->Pos).y;
    fVar49 = fVar49 + fVar56;
    IVar40.x = IVar42.x + fVar50;
    IVar40.y = IVar42.y + fVar56;
  }
  (pIVar37->NavScoringRectScreen).Min.y = fVar49 + local_78;
  fVar56 = IVar40.y + local_78;
  (pIVar37->NavScoringRectScreen).Max.y = fVar56;
  fVar50 = fVar55 + 1.0;
  if (IVar40.x <= fVar55 + 1.0) {
    fVar50 = IVar40.x;
  }
  (pIVar37->NavScoringRectScreen).Min.x = fVar50;
  (pIVar37->NavScoringRectScreen).Max.x = fVar50;
  if (fVar56 < fVar49 + local_78) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x20eb,"void ImGui::NavUpdate()");
  }
  pIVar37->NavScoringCount = 0;
  pIVar37 = GImGui;
  pIVar6 = &(GImGui->IO).MousePos;
  bVar17 = IsMousePosValid(pIVar6);
  if (bVar17) {
    IVar41 = (pIVar37->IO).MousePos;
    IVar43.x = (float)(int)IVar41.x;
    IVar43.y = (float)(int)IVar41.y;
    pIVar37->LastValidMousePos = IVar43;
    (pIVar37->IO).MousePos = IVar43;
  }
  bVar17 = IsMousePosValid(pIVar6);
  if ((bVar17) && (bVar17 = IsMousePosValid(&(pIVar37->IO).MousePosPrev), bVar17)) {
    IVar41 = (pIVar37->IO).MousePos;
    IVar40 = (pIVar37->IO).MousePosPrev;
    IVar44.x = IVar41.x - IVar40.x;
    IVar44.y = IVar41.y - IVar40.y;
    (pIVar37->IO).MouseDelta = IVar44;
    if (((IVar44.x != 0.0) || (NAN(IVar44.x))) || ((IVar44.y != 0.0 || (NAN(IVar44.y))))) {
      pIVar37->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar37->IO).MouseDelta.x = 0.0;
    (pIVar37->IO).MouseDelta.y = 0.0;
  }
  (pIVar37->IO).MousePosPrev = (pIVar37->IO).MousePos;
  for (lVar24 = 0; lVar24 != 5; lVar24 = lVar24 + 1) {
    if ((pIVar37->IO).MouseDown[lVar24] == true) {
      fVar55 = (pIVar37->IO).MouseDownDuration[lVar24];
      pbVar36 = (pIVar37->IO).MouseClicked + lVar24;
      *pbVar36 = fVar55 < 0.0;
      pbVar36[10] = false;
      (pIVar37->IO).MouseDownDurationPrev[lVar24] = fVar55;
      if (0.0 <= fVar55) {
        (pIVar37->IO).MouseDownDuration[lVar24] = fVar55 + (pIVar37->IO).DeltaTime;
        (pIVar37->IO).MouseDoubleClicked[lVar24] = false;
        bVar17 = IsMousePosValid(pIVar6);
        auVar48 = ZEXT816(0);
        if (bVar17) {
          IVar41 = (pIVar37->IO).MousePos;
          IVar40 = (pIVar37->IO).MouseClickedPos[lVar24];
          auVar48._0_4_ = IVar41.x - IVar40.x;
          auVar48._4_4_ = IVar41.y - IVar40.y;
          auVar48._8_8_ = 0;
        }
        fVar55 = (pIVar37->IO).MouseDragMaxDistanceSqr[lVar24];
        fVar49 = auVar48._0_4_ * auVar48._0_4_ + auVar48._4_4_ * auVar48._4_4_;
        uVar19 = -(uint)(fVar49 <= fVar55);
        (pIVar37->IO).MouseDragMaxDistanceSqr[lVar24] =
             (float)(~uVar19 & (uint)fVar49 | (uint)fVar55 & uVar19);
        IVar41 = (pIVar37->IO).MouseDragMaxDistanceAbs[lVar24];
        fVar55 = IVar41.x;
        fVar49 = IVar41.y;
        auVar53._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar53._8_4_ = auVar48._8_4_ ^ 0x80000000;
        auVar53._12_4_ = auVar48._12_4_ ^ 0x80000000;
        auVar52 = maxps(auVar53,auVar48);
        uVar19 = -(uint)(auVar52._0_4_ <= fVar55);
        uVar39 = -(uint)(auVar52._4_4_ <= fVar49);
        (pIVar37->IO).MouseDragMaxDistanceAbs[lVar24] =
             (ImVec2)(CONCAT44(~uVar39 & (uint)auVar52._4_4_,~uVar19 & (uint)auVar52._0_4_) |
                     CONCAT44((uint)fVar49 & uVar39,(uint)fVar55 & uVar19));
      }
      else {
        (pIVar37->IO).MouseDownDuration[lVar24] = 0.0;
        (pIVar37->IO).MouseDoubleClicked[lVar24] = false;
        dVar45 = pIVar37->Time;
        if ((float)(dVar45 - (pIVar37->IO).MouseClickedTime[lVar24]) <
            (pIVar37->IO).MouseDoubleClickTime) {
          bVar17 = IsMousePosValid(pIVar6);
          fVar55 = 0.0;
          fVar49 = 0.0;
          if (bVar17) {
            IVar41 = (pIVar37->IO).MousePos;
            IVar40 = (pIVar37->IO).MouseClickedPos[lVar24];
            fVar55 = IVar41.x - IVar40.x;
            fVar49 = IVar41.y - IVar40.y;
          }
          fVar50 = (pIVar37->IO).MouseDoubleClickMaxDist;
          dVar45 = -3.4028234663852886e+38;
          if (fVar55 * fVar55 + fVar49 * fVar49 < fVar50 * fVar50) {
            (pIVar37->IO).MouseDoubleClicked[lVar24] = true;
            dVar45 = -3.4028234663852886e+38;
          }
        }
        (pIVar37->IO).MouseClickedTime[lVar24] = dVar45;
        (pIVar37->IO).MouseClickedPos[lVar24] = (pIVar37->IO).MousePos;
        (pIVar37->IO).MouseDownWasDoubleClick[lVar24] = (pIVar37->IO).MouseDoubleClicked[lVar24];
        pIVar7 = (pIVar37->IO).MouseDragMaxDistanceAbs + lVar24;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar37->IO).MouseDragMaxDistanceSqr[lVar24] = 0.0;
      }
    }
    else {
      (pIVar37->IO).MouseClicked[lVar24] = false;
      fVar55 = (pIVar37->IO).MouseDownDuration[lVar24];
      (pIVar37->IO).MouseReleased[lVar24] = 0.0 <= fVar55;
      pbVar36 = (pIVar37->IO).MouseClicked + lVar24;
      (pIVar37->IO).MouseDownDurationPrev[lVar24] = fVar55;
      (pIVar37->IO).MouseDownDuration[lVar24] = -1.0;
      (pIVar37->IO).MouseDoubleClicked[lVar24] = false;
    }
    if (((pIVar37->IO).MouseDown[lVar24] == false) && ((pIVar37->IO).MouseReleased[lVar24] == false)
       ) {
      (pIVar37->IO).MouseDownWasDoubleClick[lVar24] = false;
    }
    if (*pbVar36 == true) {
      pIVar37->NavDisableMouseHover = false;
    }
  }
  fVar55 = (pIVar15->IO).DeltaTime;
  iVar22 = pIVar15->FramerateSecPerFrameIdx;
  pIVar15->FramerateSecPerFrameAccum =
       (fVar55 - pIVar15->FramerateSecPerFrame[iVar22]) + pIVar15->FramerateSecPerFrameAccum;
  pIVar15->FramerateSecPerFrame[iVar22] = fVar55;
  pIVar15->FramerateSecPerFrameIdx = (iVar22 + 1) % 0x78;
  uVar19 = -(uint)(0.0 < pIVar15->FramerateSecPerFrameAccum);
  (pIVar15->IO).Framerate =
       (float)(~uVar19 & 0x7f7fffff |
              (uint)(1.0 / (pIVar15->FramerateSecPerFrameAccum / 120.0)) & uVar19);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar25 = GetTopMostPopupModal();
  if ((pIVar25 != (ImGuiWindow *)0x0) ||
     ((pIVar15->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar15->NavWindowingHighlightAlpha)))) {
    fVar55 = (pIVar15->IO).DeltaTime * 6.0 + pIVar15->DimBgRatio;
    if (1.0 <= fVar55) {
      fVar55 = 1.0;
    }
    pIVar15->DimBgRatio = fVar55;
  }
  else {
    fVar55 = (pIVar15->IO).DeltaTime * -10.0 + pIVar15->DimBgRatio;
    pIVar15->DimBgRatio = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
  }
  pIVar15->MouseCursor = 0;
  pIVar15->WantTextInputNextFrame = -1;
  pIVar15->WantCaptureMouseNextFrame = -1;
  pIVar15->WantCaptureKeyboardNextFrame = -1;
  (pIVar15->PlatformImePos).x = 1.0;
  pIVar37 = GImGui;
  (pIVar15->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar17 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar17) &&
        (fVar55 = (pIVar37->IO).MouseDragThreshold,
        fVar49 = (pIVar37->IO).MousePos.x - (pIVar37->WheelingWindowRefMousePos).x,
        fVar50 = (pIVar37->IO).MousePos.y - (pIVar37->WheelingWindowRefMousePos).y,
        fVar55 * fVar55 < fVar49 * fVar49 + fVar50 * fVar50)) ||
       (pIVar37->WheelingWindowTimer <= 0.0)) {
      pIVar37->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar37->WheelingWindowTimer = 0.0;
    }
  }
  fVar55 = (pIVar37->IO).MouseWheel;
  if (((((fVar55 != 0.0) || (fVar49 = (pIVar37->IO).MouseWheelH, fVar49 != 0.0)) || (NAN(fVar49)))
      && ((pIVar25 = pIVar37->WheelingWindow, pIVar25 != (ImGuiWindow *)0x0 ||
          (pIVar25 = pIVar37->HoveredWindow, pIVar25 != (ImGuiWindow *)0x0)))) &&
     (pIVar25->Collapsed == false)) {
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      if ((pIVar37->IO).KeyCtrl == true) {
        if ((pIVar37->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar25);
          fVar55 = pIVar25->FontWindowScale;
          fVar50 = (pIVar37->IO).MouseWheel * 0.1 + fVar55;
          fVar49 = 2.5;
          if (fVar50 <= 2.5) {
            fVar49 = fVar50;
          }
          fVar49 = (float)(-(uint)(fVar50 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar50 < 0.5) & (uint)fVar49);
          pIVar25->FontWindowScale = fVar49;
          if ((pIVar25->Flags & 0x1000000) == 0) {
            fVar49 = fVar49 / fVar55;
            IVar41 = pIVar25->Size;
            IVar40 = (pIVar37->IO).MousePos;
            fVar55 = (pIVar25->Pos).x;
            fVar50 = (pIVar25->Pos).y;
            auVar54._0_4_ = (IVar40.x - fVar55) * (1.0 - fVar49) * IVar41.x;
            auVar54._4_4_ = (IVar40.y - fVar50) * (1.0 - fVar49) * IVar41.y;
            auVar54._8_8_ = 0;
            auVar11._8_8_ = 0;
            auVar11._0_4_ = IVar41.x;
            auVar11._4_4_ = IVar41.y;
            auVar52 = divps(auVar54,auVar11);
            rect_abs.Min.x = auVar52._0_4_ + fVar55;
            rect_abs.Min.y = auVar52._4_4_ + fVar50;
            SetWindowPos(pIVar25,&rect_abs.Min,0);
            IVar46.x = (float)(int)((pIVar25->Size).x * fVar49);
            IVar46.y = (float)(int)((pIVar25->Size).y * fVar49);
            IVar10.y = (float)(int)((pIVar25->SizeFull).y * fVar49);
            IVar10.x = (float)(int)((pIVar25->SizeFull).x * fVar49);
            pIVar25->Size = IVar46;
            pIVar25->SizeFull = IVar10;
          }
          goto LAB_0014707a;
        }
      }
      else if ((pIVar37->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar25);
        while ((uVar19 = pIVar25->Flags, (uVar19 >> 0x18 & 1) != 0 &&
               (((uVar19 & 0x210) == 0x10 ||
                ((fVar49 = (pIVar25->ScrollMax).y, fVar49 == 0.0 && (!NAN(fVar49)))))))) {
          pIVar25 = pIVar25->ParentWindow;
        }
        if ((uVar19 & 0x210) == 0) {
          fVar50 = ((pIVar25->InnerRect).Max.y - (pIVar25->InnerRect).Min.y) * 0.67;
          fVar56 = ImGuiWindow::CalcFontSize(pIVar25);
          fVar49 = fVar56 * 5.0;
          if (fVar50 <= fVar56 * 5.0) {
            fVar49 = fVar50;
          }
          (pIVar25->ScrollTarget).y = (pIVar25->Scroll).y - fVar55 * (float)(int)fVar49;
          (pIVar25->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    fVar55 = (pIVar37->IO).MouseWheelH;
    if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar37->IO).KeyShift == true)) {
      fVar55 = (pIVar37->IO).MouseWheel;
      if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar37->IO).KeyShift != true))
      goto LAB_0014707a;
    }
    if ((pIVar37->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar25);
      while ((uVar19 = pIVar25->Flags, (uVar19 >> 0x18 & 1) != 0 &&
             (((uVar19 & 0x210) == 0x10 ||
              ((fVar49 = (pIVar25->ScrollMax).x, fVar49 == 0.0 && (!NAN(fVar49)))))))) {
        pIVar25 = pIVar25->ParentWindow;
      }
      if ((uVar19 & 0x210) == 0) {
        fVar50 = ((pIVar25->InnerRect).Max.x - (pIVar25->InnerRect).Min.x) * 0.67;
        fVar56 = ImGuiWindow::CalcFontSize(pIVar25);
        fVar49 = fVar56 + fVar56;
        if (fVar50 <= fVar56 + fVar56) {
          fVar49 = fVar50;
        }
        (pIVar25->ScrollTarget).x = (pIVar25->Scroll).x - fVar55 * (float)(int)fVar49;
        (pIVar25->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_0014707a:
  pIVar25 = pIVar15->NavWindow;
  if ((((pIVar25 == (ImGuiWindow *)0x0) || (pIVar25->Active != true)) ||
      ((pIVar25->Flags & 0x40000) != 0)) || ((pIVar15->IO).KeyCtrl != false)) {
    bVar17 = false;
  }
  else {
    bVar17 = IsKeyPressedMap(0,true);
  }
  pIVar15->FocusTabPressed = bVar17;
  if ((bVar17 == false) || (pIVar15->ActiveId != 0)) {
    pIVar25 = pIVar15->FocusRequestNextWindow;
  }
  else {
    pIVar25 = pIVar15->NavWindow;
    pIVar15->FocusRequestNextWindow = pIVar25;
    pIVar15->FocusRequestNextCounterAll = 0x7fffffff;
    if ((pIVar15->NavId == 0) || (pIVar15->NavIdTabCounter == 0x7fffffff)) {
      iVar22 = -(uint)(pIVar15->IO).KeyShift;
    }
    else {
      iVar22 = pIVar15->NavIdTabCounter + (-(uint)(pIVar15->IO).KeyShift | 1) + 1;
    }
    pIVar15->FocusRequestNextCounterTab = iVar22;
  }
  pIVar15->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar15->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar15->FocusRequestCurrCounterTab = 0x7fffffff;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    pIVar15->FocusRequestCurrWindow = pIVar25;
    if ((pIVar15->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar22 = (pIVar25->DC).FocusCounterAll, iVar22 != -1)) {
      pIVar15->FocusRequestCurrCounterAll =
           (pIVar15->FocusRequestNextCounterAll + iVar22 + 1) % (iVar22 + 1);
    }
    if ((pIVar15->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar22 = (pIVar25->DC).FocusCounterTab, iVar22 != -1)) {
      pIVar15->FocusRequestCurrCounterTab =
           (pIVar15->FocusRequestNextCounterTab + iVar22 + 1) % (iVar22 + 1);
    }
    pIVar15->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar15->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar15->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar15->NavIdTabCounter = 0x7fffffff;
  iVar22 = (pIVar15->WindowsFocusOrder).Size;
  if (iVar22 == (pIVar15->Windows).Size) {
    for (i = 0; i != iVar22; i = i + 1) {
      ppIVar27 = ImVector<ImGuiWindow_*>::operator[](&pIVar15->Windows,i);
      pIVar25 = *ppIVar27;
      pIVar25->WasActive = pIVar25->Active;
      pIVar25->BeginCount = 0;
      pIVar25->Active = false;
      pIVar25->WriteAccessed = false;
      iVar22 = (pIVar15->Windows).Size;
    }
    if ((pIVar15->NavWindow != (ImGuiWindow *)0x0) && (pIVar15->NavWindow->WasActive == false)) {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindow_*>::resize(&pIVar15->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&pIVar15->BeginPopupStack,0);
    ClosePopupsOverWindow(pIVar15->NavWindow,false);
    pIVar37 = GImGui;
    GImGui->DebugItemPickerBreakID = 0;
    if (pIVar37->DebugItemPickerActive == true) {
      uVar19 = pIVar37->HoveredIdPreviousFrame;
      pIVar37->MouseCursor = 7;
      bVar17 = IsKeyPressedMap(0xe,true);
      if (bVar17) {
        pIVar37->DebugItemPickerActive = false;
      }
      pIVar16 = GImGui;
      fVar55 = (GImGui->IO).MouseDownDuration[0];
      if ((fVar55 != 0.0) || (NAN(fVar55))) {
        uVar39 = (uint)(uVar19 == 0);
      }
      else if (uVar19 == 0) {
        uVar39 = 1;
      }
      else {
        pIVar37->DebugItemPickerBreakID = uVar19;
        pIVar37->DebugItemPickerActive = false;
        uVar39 = 0;
      }
      pIVar4 = &pIVar16->NextWindowData;
      *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
      (pIVar16->NextWindowData).BgAlphaVal = 0.6;
      BeginTooltip();
      Text("HoveredId: 0x%08X",(ulong)uVar19);
      Text("Press ESC to abort picking.");
      TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar39 << 4)),
                  "Click to break in debugger!");
      EndTooltip();
      pIVar37 = GImGui;
    }
    *(byte *)&(pIVar37->NextWindowData).Flags = (byte)(pIVar37->NextWindowData).Flags | 2;
    (pIVar37->NextWindowData).SizeVal.x = 400.0;
    (pIVar37->NextWindowData).SizeVal.y = 400.0;
    (pIVar37->NextWindowData).SizeCond = 4;
    Begin("Debug##Default",(bool *)0x0,0);
    pIVar15->FrameScopePushedImplicitWindow = true;
    return;
  }
  __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                ,0xee7,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}